

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O3

Writer * __thiscall JSON::Writer::writeBase64(Writer *this,string_view sv)

{
  size_t __n;
  Pl_Base64 base;
  Pl_Concatenate cat;
  Pl_Base64 local_a0;
  Pl_Concatenate local_58;
  
  Pl_Concatenate::Pl_Concatenate(&local_58,"writer concat",this->p);
  __n = 0;
  Pl_Base64::Pl_Base64(&local_a0,"writer base64",&local_58.super_Pipeline,a_encode);
  Pl_Base64::write(&local_a0,(int)sv._M_str,(void *)sv._M_len,__n);
  Pl_Base64::finish(&local_a0);
  local_a0.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002eb1f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.super_Pipeline.identifier._M_dataplus._M_p !=
      &local_a0.super_Pipeline.identifier.field_2) {
    operator_delete(local_a0.super_Pipeline.identifier._M_dataplus._M_p,
                    local_a0.super_Pipeline.identifier.field_2._M_allocated_capacity + 1);
  }
  Pl_Concatenate::~Pl_Concatenate(&local_58);
  return this;
}

Assistant:

Writer&
    writeBase64(std::string_view sv)
    {
        Pl_Concatenate cat{"writer concat", p};
        Pl_Base64 base{"writer base64", &cat, Pl_Base64::a_encode};
        base.write(reinterpret_cast<unsigned char const*>(sv.data()), sv.size());
        base.finish();
        return *this;
    }